

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_kwp.c
# Opt level: O0

err_t beltKWPWrap(octet *dest,octet *src,size_t count,octet *header,octet *key,size_t len)

{
  bool_t bVar1;
  blob_t dest_00;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *in_R8;
  octet *in_R9;
  void *state;
  undefined7 in_stack_ffffffffffffffb8;
  octet in_stack_ffffffffffffffbf;
  
  if ((((((void *)0xf < in_RDX) &&
        ((((in_R9 == (octet *)0x10 || (in_R9 == (octet *)0x18)) || (in_R9 == (octet *)0x20)) &&
         (bVar1 = memIsValid(in_RSI,(size_t)in_RDX), bVar1 != 0)))) &&
       ((in_RCX == (void *)0x0 || (bVar1 = memIsValid(in_RCX,0x10), bVar1 != 0)))) &&
      ((in_RCX == (void *)0x0 ||
       (bVar1 = memIsDisjoint2(in_RSI,(size_t)in_RDX,in_RCX,0x10), bVar1 != 0)))) &&
     ((bVar1 = memIsValid(in_R8,(size_t)in_R9), bVar1 != 0 &&
      (bVar1 = memIsValid(in_RDI,(long)in_RDX + 0x10), bVar1 != 0)))) {
    beltWBL_keep();
    dest_00 = blobCreate(CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    if (dest_00 == (blob_t)0x0) {
      return 0x6e;
    }
    beltWBLStart(in_R8,in_R9,(size_t)dest_00);
    memMove(dest_00,(void *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0x14ba1a);
    if (in_RCX == (void *)0x0) {
      memSet(dest_00,in_stack_ffffffffffffffbf,0x14ba59);
    }
    else {
      memJoin(in_RDX,in_RCX,(size_t)in_R8,in_R9,(size_t)dest_00);
    }
    beltWBLStepE(in_R8,(size_t)in_R9,dest_00);
    blobClose((blob_t)0x14ba7b);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltKWPWrap(octet dest[], const octet src[], size_t count,
	const octet header[16], const octet key[], size_t len)
{
	void* state;
	// проверить входные данные
	if (count < 16 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsNullOrValid(header, 16) ||
		header && !memIsDisjoint2(src, count, header, 16) ||
		!memIsValid(key, len) ||
		!memIsValid(dest, count + 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltKWP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// установить защиту
	beltKWPStart(state, key, len);
	memMove(dest, src, count);
	if (header)
		memJoin(dest, src, count, header, 16);
	else
		memSetZero(dest + count, 16);
	beltKWPStepE(dest, count + 16, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}